

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void EV_StartLightFading(int tag,int value,int tics)

{
  DSectorEffect *pDVar1;
  DGlow2 *this;
  sector_t_conflict *len;
  sector_t_conflict *sector;
  sector_t *sec;
  FSectorTagIterator it;
  int secnum;
  int tics_local;
  int value_local;
  int tag_local;
  
  len = (sector_t_conflict *)(ulong)(uint)tag;
  it.start = tics;
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)&sec,tag);
  while (it.searchtag = FSectorTagIterator::Next((FSectorTagIterator *)&sec), -1 < it.searchtag) {
    sector = sectors + it.searchtag;
    pDVar1 = TObjPtr::operator_cast_to_DSectorEffect_((TObjPtr *)&sector->lightingdata);
    if (pDVar1 == (DSectorEffect *)0x0) {
      if (it.start < 1) {
        len = (sector_t_conflict *)(ulong)(uint)value;
        sector_t::SetLightLevel((sector_t *)sector,value);
      }
      else if (sector->lightlevel != value) {
        this = (DGlow2 *)DObject::operator_new((DObject *)0x58,(size_t)len);
        DGlow2::DGlow2(this,(sector_t *)sector,(int)sector->lightlevel,value,it.start,true);
        len = sector;
      }
    }
  }
  return;
}

Assistant:

void EV_StartLightFading (int tag, int value, int tics)
{
	int secnum;
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sector_t *sec = &sectors[secnum];
		if (sec->lightingdata)
			continue;

		if (tics <= 0)
		{
			sec->SetLightLevel(value);
		}
		else
		{
			// No need to fade if lightlevel is already at desired value.
			if (sec->lightlevel == value)
				continue;

			new DGlow2 (sec, sec->lightlevel, value, tics, true);
		}
	}
}